

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow *window)

{
  ImGuiViewportP *this;
  float fVar1;
  float local_44;
  float local_3c;
  ImVec2 local_38;
  undefined8 local_30;
  ImVec2 padding;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  ImRect r_screen;
  
  padding = (ImVec2)GImGui;
  this = (ImGuiViewportP *)GetMainViewport();
  _window_local = ImGuiViewportP::GetMainRect(this);
  local_30 = *(undefined8 *)((long)padding + 0x160c);
  fVar1 = ImRect::GetWidth((ImRect *)&window_local);
  if (fVar1 <= (float)local_30 * 2.0) {
    local_3c = 0.0;
  }
  else {
    local_3c = -(float)local_30;
  }
  fVar1 = ImRect::GetHeight((ImRect *)&window_local);
  if (fVar1 <= local_30._4_4_ * 2.0) {
    local_44 = 0.0;
  }
  else {
    local_44 = -local_30._4_4_;
  }
  ImVec2::ImVec2(&local_38,local_3c,local_44);
  ImRect::Expand((ImRect *)&window_local,&local_38);
  return _window_local;
}

Assistant:

ImRect ImGui::GetPopupAllowedExtentRect(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_UNUSED(window);
    ImRect r_screen = ((ImGuiViewportP*)(void*)GetMainViewport())->GetMainRect();
    ImVec2 padding = g.Style.DisplaySafeAreaPadding;
    r_screen.Expand(ImVec2((r_screen.GetWidth() > padding.x * 2) ? -padding.x : 0.0f, (r_screen.GetHeight() > padding.y * 2) ? -padding.y : 0.0f));
    return r_screen;
}